

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::doFLiteral(Forth *this)

{
  FCell x;
  
  requireFStackAvailable(this,1,"(FLIT)");
  x = getDataFCell(this,this->next_command);
  ForthStack<double>::push(&this->fStack,x);
  this->next_command = this->next_command + 8;
  return;
}

Assistant:

void doFLiteral() {
			REQUIRE_FSTACK_AVAILABLE(1, "(FLIT)");
			fStack.push(getDataFCell(next_command));
			next_command += sizeof(FCell);
		}